

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_cpool_disconnect(Curl_easy *data,connectdata *conn,_Bool aborted)

{
  _Bool aborted_00;
  cpool *cpool_00;
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  _Bool do_lock;
  cpool *cpool;
  _Bool aborted_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  cpool_00 = cpool_get_instance(data);
  if ((cpool_00 != (cpool *)0x0) &&
     ((sVar1 = Curl_llist_count(&conn->easyq), sVar1 == 0 || (aborted)))) {
    bVar3 = false;
    if (cpool_00 != (cpool *)0x0) {
      bVar3 = (cpool_00->field_0x98 & 1) != 0;
    }
    if (((bool)(bVar3 ^ 1U)) && (cpool_00 != (cpool *)0x0)) {
      if ((cpool_00->share != (Curl_share *)0x0) && ((cpool_00->share->specifier & 0x20) != 0)) {
        Curl_share_lock(cpool_00->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      }
      cpool_00->field_0x98 = cpool_00->field_0x98 & 0xfe | 1;
    }
    if (((ulong)conn->bits >> 0x21 & 1) != 0) {
      cpool_remove_conn(cpool_00,conn);
    }
    aborted_00 = (*cpool_00->disconnect_cb)(data,conn,aborted);
    if (data->multi == (Curl_multi *)0x0) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"closing connection #%ld",conn->connection_id);
      }
      cpool_close_and_destroy((cpool *)0x0,conn,data,(_Bool)((aborted_00 ^ 0xffU) & 1));
    }
    else {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        pcVar2 = "shutting down";
        if (aborted_00) {
          pcVar2 = "closing";
        }
        Curl_infof(data,"%s connection #%ld",pcVar2,conn->connection_id);
      }
      cpool_discard_conn(&data->multi->cpool,data,conn,aborted_00);
    }
    if (((((bool)(bVar3 ^ 1U)) && (cpool_00 != (cpool *)0x0)) &&
        (cpool_00->field_0x98 = cpool_00->field_0x98 & 0xfe, cpool_00->share != (Curl_share *)0x0))
       && ((cpool_00->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(cpool_00->idata,CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_cpool_disconnect(struct Curl_easy *data,
                           struct connectdata *conn,
                           bool aborted)
{
  struct cpool *cpool = cpool_get_instance(data);
  bool do_lock;

  DEBUGASSERT(cpool);
  DEBUGASSERT(data && !data->conn);
  if(!cpool)
    return;

  /* If this connection is not marked to force-close, leave it open if there
   * are other users of it */
  if(CONN_INUSE(conn) && !aborted) {
    DEBUGASSERT(0); /* does this ever happen? */
    DEBUGF(infof(data, "Curl_disconnect when inuse: %zu", CONN_INUSE(conn)));
    return;
  }

  /* This method may be called while we are under lock, e.g. from a
   * user callback in find. */
  do_lock = !CPOOL_IS_LOCKED(cpool);
  if(do_lock)
    CPOOL_LOCK(cpool);

  if(conn->bits.in_cpool) {
    cpool_remove_conn(cpool, conn);
    DEBUGASSERT(!conn->bits.in_cpool);
  }

  /* Run the callback to let it clean up anything it wants to. */
  aborted = cpool->disconnect_cb(data, conn, aborted);

  if(data->multi) {
    /* Add it to the multi's cpool for shutdown handling */
    infof(data, "%s connection #%" FMT_OFF_T,
          aborted ? "closing" : "shutting down", conn->connection_id);
    cpool_discard_conn(&data->multi->cpool, data, conn, aborted);
  }
  else {
    /* No multi available. Make a best-effort shutdown + close */
    infof(data, "closing connection #%" FMT_OFF_T, conn->connection_id);
    cpool_close_and_destroy(NULL, conn, data, !aborted);
  }

  if(do_lock)
    CPOOL_UNLOCK(cpool);
}